

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningPlugin.cpp
# Opt level: O0

void MemoryLeakWarningPlugin::turnOffNewDeleteOverloads(void)

{
  operator_new_fptr = normal_operator_new;
  operator_new_nothrow_fptr = normal_operator_new_nothrow;
  operator_new_debug_fptr = normal_operator_new_debug;
  operator_new_array_fptr = normal_operator_new_array;
  operator_new_array_nothrow_fptr = normal_operator_new_array_nothrow;
  operator_new_array_debug_fptr = normal_operator_new_array_debug;
  operator_delete_fptr = normal_operator_delete;
  operator_delete_array_fptr = normal_operator_delete_array;
  malloc_fptr = normal_malloc;
  realloc_fptr = normal_realloc;
  free_fptr = normal_free;
  return;
}

Assistant:

void MemoryLeakWarningPlugin::turnOffNewDeleteOverloads()
{
#if CPPUTEST_USE_MEM_LEAK_DETECTION
    operator_new_fptr = normal_operator_new;
    operator_new_nothrow_fptr = normal_operator_new_nothrow;
    operator_new_debug_fptr = normal_operator_new_debug;
    operator_new_array_fptr = normal_operator_new_array;
    operator_new_array_nothrow_fptr = normal_operator_new_array_nothrow;
    operator_new_array_debug_fptr = normal_operator_new_array_debug;
    operator_delete_fptr = normal_operator_delete;
    operator_delete_array_fptr = normal_operator_delete_array;
    malloc_fptr = normal_malloc;
    realloc_fptr = normal_realloc;
    free_fptr = normal_free;

#endif
}